

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O2

void duckdb::CountStarFunction::Window<long>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t param_3,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  data_ptr_t pdVar1;
  pointer pFVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  FrameBounds *frame;
  pointer pFVar6;
  idx_t i;
  idx_t row_idx;
  
  pdVar1 = result->data;
  pFVar2 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = 0;
  for (pFVar6 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                _M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar2; pFVar6 = pFVar6 + 1) {
    row_idx = pFVar6->start;
    uVar3 = pFVar6->end;
    if ((partition->filter_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) {
      lVar5 = (lVar5 - row_idx) + uVar3;
    }
    else {
      for (; row_idx < uVar3; row_idx = row_idx + 1) {
        bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&partition->filter_mask->super_TemplatedValidityMask<unsigned_long>,
                           row_idx);
        lVar5 = lVar5 + (ulong)bVar4;
      }
    }
  }
  *(long *)(pdVar1 + rid * 8) = lVar5;
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition, const_data_ptr_t,
	                   data_ptr_t l_state, const SubFrames &frames, Vector &result, idx_t rid) {
		D_ASSERT(partition.column_ids.empty());

		auto data = FlatVector::GetData<RESULT_TYPE>(result);
		RESULT_TYPE total = 0;
		for (const auto &frame : frames) {
			const auto begin = frame.start;
			const auto end = frame.end;

			// Slice to any filtered rows
			if (partition.filter_mask.AllValid()) {
				total += end - begin;
				continue;
			}
			for (auto i = begin; i < end; ++i) {
				total += partition.filter_mask.RowIsValid(i);
			}
		}
		data[rid] = total;
	}